

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Compilation.cpp
# Opt level: O2

void __thiscall
slang::ast::Compilation::noteExternDefinition(Compilation *this,Scope *scope,SyntaxNode *syntax)

{
  group_type_pointer pgVar1;
  RootSymbol *pRVar2;
  group_type_pointer pgVar3;
  value_type_pointer ppVar4;
  ulong uVar5;
  Scope *pSVar6;
  int iVar7;
  bool bVar8;
  uint uVar9;
  size_t hash;
  SourceLocation SVar10;
  Diagnostic *this_00;
  byte bVar11;
  ulong pos0;
  tuple<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Scope_*> *__u;
  ulong uVar12;
  long lVar13;
  ulong uVar14;
  ulong uVar15;
  undefined1 auVar16 [16];
  uchar uVar17;
  uchar uVar18;
  uchar uVar19;
  byte bVar20;
  uchar uVar21;
  uchar uVar22;
  uchar uVar23;
  byte bVar24;
  uchar uVar25;
  uchar uVar26;
  uchar uVar27;
  byte bVar28;
  uchar uVar29;
  uchar uVar30;
  uchar uVar31;
  byte bVar32;
  string_view name;
  Token nameToken;
  undefined8 in_stack_ffffffffffffff08;
  try_emplace_args_t local_e9;
  Scope *local_e8;
  table_core<boost::unordered::detail::foa::flat_map_types<std::tuple<std::basic_string_view<char,std::char_traits<char>>,slang::ast::Scope_const*>,slang::syntax::SyntaxNode_const*>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<std::tuple<std::basic_string_view<char,std::char_traits<char>>,slang::ast::Scope_const*>,void>,std::equal_to<std::tuple<std::basic_string_view<char,std::char_traits<char>>,slang::ast::Scope_const*>>,std::allocator<std::pair<std::tuple<std::basic_string_view<char,std::char_traits<char>>,slang::ast::Scope_const*>const,slang::syntax::SyntaxNode_const*>>>
  *local_e0;
  string_view local_d8;
  SyntaxNode *local_c8;
  ulong local_c0;
  ulong local_b8;
  ulong local_b0;
  ulong local_a8;
  size_t local_a0;
  SyntaxNode *local_98;
  tuple<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Scope_*> local_90;
  uchar local_78;
  uchar uStack_77;
  uchar uStack_76;
  byte bStack_75;
  uchar uStack_74;
  uchar uStack_73;
  uchar uStack_72;
  byte bStack_71;
  uchar uStack_70;
  uchar uStack_6f;
  uchar uStack_6e;
  byte bStack_6d;
  uchar uStack_6c;
  uchar uStack_6b;
  uchar uStack_6a;
  byte bStack_69;
  uchar local_68;
  uchar uStack_67;
  uchar uStack_66;
  byte bStack_65;
  uchar uStack_64;
  uchar uStack_63;
  uchar uStack_62;
  byte bStack_61;
  uchar uStack_60;
  uchar uStack_5f;
  uchar uStack_5e;
  byte bStack_5d;
  uchar uStack_5c;
  uchar uStack_5b;
  uchar uStack_5a;
  byte bStack_59;
  Token local_58;
  locator local_48;
  
  local_58 = getExternNameToken(syntax);
  local_d8 = parsing::Token::valueText(&local_58);
  if (local_d8._M_len != 0) {
    pRVar2 = (this->root)._M_t.
             super___uniq_ptr_impl<slang::ast::RootSymbol,_std::default_delete<slang::ast::RootSymbol>_>
             ._M_t.
             super__Tuple_impl<0UL,_slang::ast::RootSymbol_*,_std::default_delete<slang::ast::RootSymbol>_>
             .super__Head_base<0UL,_slang::ast::RootSymbol_*,_false>._M_head_impl;
    local_90.
    super__Tuple_impl<0UL,_std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Scope_*>
    .super__Tuple_impl<1UL,_const_slang::ast::Scope_*>.
    super__Head_base<1UL,_const_slang::ast::Scope_*,_false>._M_head_impl =
         (_Head_base<1UL,_const_slang::ast::Scope_*,_false>)&pRVar2->super_Scope;
    if (pRVar2 == (RootSymbol *)0x0) {
      local_90.
      super__Tuple_impl<0UL,_std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Scope_*>
      .super__Tuple_impl<1UL,_const_slang::ast::Scope_*>.
      super__Head_base<1UL,_const_slang::ast::Scope_*,_false>._M_head_impl =
           (_Head_base<1UL,_const_slang::ast::Scope_*,_false>)(Scope *)0x0;
    }
    if (scope->thisSym->kind != CompilationUnit) {
      local_90.
      super__Tuple_impl<0UL,_std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Scope_*>
      .super__Tuple_impl<1UL,_const_slang::ast::Scope_*>.
      super__Head_base<1UL,_const_slang::ast::Scope_*,_false>._M_head_impl =
           (_Head_base<1UL,_const_slang::ast::Scope_*,_false>)
           (_Head_base<1UL,_const_slang::ast::Scope_*,_false>)scope;
    }
    local_e0 = (table_core<boost::unordered::detail::foa::flat_map_types<std::tuple<std::basic_string_view<char,std::char_traits<char>>,slang::ast::Scope_const*>,slang::syntax::SyntaxNode_const*>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<std::tuple<std::basic_string_view<char,std::char_traits<char>>,slang::ast::Scope_const*>,void>,std::equal_to<std::tuple<std::basic_string_view<char,std::char_traits<char>>,slang::ast::Scope_const*>>,std::allocator<std::pair<std::tuple<std::basic_string_view<char,std::char_traits<char>>,slang::ast::Scope_const*>const,slang::syntax::SyntaxNode_const*>>>
                *)&this->externDefMap;
    local_c8 = syntax;
    local_98 = syntax;
    local_90.
    super__Tuple_impl<0UL,_std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Scope_*>
    .super__Head_base<0UL,_std::basic_string_view<char,_std::char_traits<char>_>,_false>.
    _M_head_impl = local_d8;
    hash = boost::unordered::detail::foa::mulx_mix::
           mix<slang::hash<std::tuple<std::basic_string_view<char,std::char_traits<char>>,slang::ast::Scope_const*>,void>,std::tuple<std::basic_string_view<char,std::char_traits<char>>,slang::ast::Scope_const*>>
                     ((hash<std::tuple<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Scope_*>,_void>
                       *)local_e0,&local_90);
    pos0 = hash >> ((byte)(this->externDefMap).table_.
                          super_table_core_impl<boost::unordered::detail::foa::flat_map_types<std::tuple<std::basic_string_view<char>,_const_slang::ast::Scope_*>,_const_slang::syntax::SyntaxNode_*>,_slang::hash<std::tuple<std::basic_string_view<char>,_const_slang::ast::Scope_*>_>,_std::equal_to<std::tuple<std::basic_string_view<char>,_const_slang::ast::Scope_*>_>,_std::allocator<std::pair<const_std::tuple<std::basic_string_view<char>,_const_slang::ast::Scope_*>,_const_slang::syntax::SyntaxNode_*>_>_>
                          .arrays.groups_size_index & 0x3f);
    lVar13 = (hash & 0xff) * 4;
    uVar17 = (&UNK_004a00ac)[lVar13];
    uVar18 = (&UNK_004a00ad)[lVar13];
    uVar19 = (&UNK_004a00ae)[lVar13];
    bVar20 = (&UNK_004a00af)[lVar13];
    uVar15 = (ulong)((uint)hash & 7);
    uVar12 = 0;
    uVar14 = pos0;
    uVar21 = uVar17;
    uVar22 = uVar18;
    uVar23 = uVar19;
    bVar24 = bVar20;
    uVar25 = uVar17;
    uVar26 = uVar18;
    uVar27 = uVar19;
    bVar28 = bVar20;
    uVar29 = uVar17;
    uVar30 = uVar18;
    uVar31 = uVar19;
    bVar32 = bVar20;
    do {
      pgVar3 = (this->externDefMap).table_.
               super_table_core_impl<boost::unordered::detail::foa::flat_map_types<std::tuple<std::basic_string_view<char>,_const_slang::ast::Scope_*>,_const_slang::syntax::SyntaxNode_*>,_slang::hash<std::tuple<std::basic_string_view<char>,_const_slang::ast::Scope_*>_>,_std::equal_to<std::tuple<std::basic_string_view<char>,_const_slang::ast::Scope_*>_>,_std::allocator<std::pair<const_std::tuple<std::basic_string_view<char>,_const_slang::ast::Scope_*>,_const_slang::syntax::SyntaxNode_*>_>_>
               .arrays.groups_;
      pgVar1 = pgVar3 + uVar14;
      local_68 = pgVar1->m[0].n;
      uStack_67 = pgVar1->m[1].n;
      uStack_66 = pgVar1->m[2].n;
      bStack_65 = pgVar1->m[3].n;
      uStack_64 = pgVar1->m[4].n;
      uStack_63 = pgVar1->m[5].n;
      uStack_62 = pgVar1->m[6].n;
      bStack_61 = pgVar1->m[7].n;
      uStack_60 = pgVar1->m[8].n;
      uStack_5f = pgVar1->m[9].n;
      uStack_5e = pgVar1->m[10].n;
      bStack_5d = pgVar1->m[0xb].n;
      uStack_5c = pgVar1->m[0xc].n;
      uStack_5b = pgVar1->m[0xd].n;
      uStack_5a = pgVar1->m[0xe].n;
      bVar11 = pgVar1->m[0xf].n;
      auVar16[0] = -(local_68 == uVar17);
      auVar16[1] = -(uStack_67 == uVar18);
      auVar16[2] = -(uStack_66 == uVar19);
      auVar16[3] = -(bStack_65 == bVar20);
      auVar16[4] = -(uStack_64 == uVar21);
      auVar16[5] = -(uStack_63 == uVar22);
      auVar16[6] = -(uStack_62 == uVar23);
      auVar16[7] = -(bStack_61 == bVar24);
      auVar16[8] = -(uStack_60 == uVar25);
      auVar16[9] = -(uStack_5f == uVar26);
      auVar16[10] = -(uStack_5e == uVar27);
      auVar16[0xb] = -(bStack_5d == bVar28);
      auVar16[0xc] = -(uStack_5c == uVar29);
      auVar16[0xd] = -(uStack_5b == uVar30);
      auVar16[0xe] = -(uStack_5a == uVar31);
      auVar16[0xf] = -(bVar11 == bVar32);
      uVar9 = (uint)(ushort)((ushort)(SUB161(auVar16 >> 7,0) & 1) |
                             (ushort)(SUB161(auVar16 >> 0xf,0) & 1) << 1 |
                             (ushort)(SUB161(auVar16 >> 0x17,0) & 1) << 2 |
                             (ushort)(SUB161(auVar16 >> 0x1f,0) & 1) << 3 |
                             (ushort)(SUB161(auVar16 >> 0x27,0) & 1) << 4 |
                             (ushort)(SUB161(auVar16 >> 0x2f,0) & 1) << 5 |
                             (ushort)(SUB161(auVar16 >> 0x37,0) & 1) << 6 |
                             (ushort)(SUB161(auVar16 >> 0x3f,0) & 1) << 7 |
                             (ushort)(SUB161(auVar16 >> 0x47,0) & 1) << 8 |
                             (ushort)(SUB161(auVar16 >> 0x4f,0) & 1) << 9 |
                             (ushort)(SUB161(auVar16 >> 0x57,0) & 1) << 10 |
                             (ushort)(SUB161(auVar16 >> 0x5f,0) & 1) << 0xb |
                             (ushort)(SUB161(auVar16 >> 0x67,0) & 1) << 0xc |
                             (ushort)(SUB161(auVar16 >> 0x6f,0) & 1) << 0xd |
                            (ushort)(SUB161(auVar16 >> 0x77,0) & 1) << 0xe);
      bStack_59 = bVar11;
      if (uVar9 != 0) {
        ppVar4 = (this->externDefMap).table_.
                 super_table_core_impl<boost::unordered::detail::foa::flat_map_types<std::tuple<std::basic_string_view<char>,_const_slang::ast::Scope_*>,_const_slang::syntax::SyntaxNode_*>,_slang::hash<std::tuple<std::basic_string_view<char>,_const_slang::ast::Scope_*>_>,_std::equal_to<std::tuple<std::basic_string_view<char>,_const_slang::ast::Scope_*>_>,_std::allocator<std::pair<const_std::tuple<std::basic_string_view<char>,_const_slang::ast::Scope_*>,_const_slang::syntax::SyntaxNode_*>_>_>
                 .arrays.elements_;
        local_e8 = scope;
        local_c0 = pos0;
        local_b8 = uVar15;
        local_b0 = uVar14;
        local_a8 = uVar12;
        local_a0 = hash;
        local_78 = uVar17;
        uStack_77 = uVar18;
        uStack_76 = uVar19;
        bStack_75 = bVar20;
        uStack_74 = uVar21;
        uStack_73 = uVar22;
        uStack_72 = uVar23;
        bStack_71 = bVar24;
        uStack_70 = uVar25;
        uStack_6f = uVar26;
        uStack_6e = uVar27;
        bStack_6d = bVar28;
        uStack_6c = uVar29;
        uStack_6b = uVar30;
        uStack_6a = uVar31;
        bStack_69 = bVar32;
        do {
          iVar7 = 0;
          if (uVar9 != 0) {
            for (; (uVar9 >> iVar7 & 1) == 0; iVar7 = iVar7 + 1) {
            }
          }
          __u = (tuple<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Scope_*>
                 *)((long)&ppVar4[uVar14 * 0xf].first.
                           super__Tuple_impl<0UL,_std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Scope_*>
                           .super__Tuple_impl<1UL,_const_slang::ast::Scope_*>.
                           super__Head_base<1UL,_const_slang::ast::Scope_*,_false>._M_head_impl +
                   (ulong)(uint)(iVar7 << 5));
          bVar8 = std::
                  __tuple_compare<std::tuple<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Scope_*>,_std::tuple<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Scope_*>,_0UL,_2UL>
                  ::__eq(&local_90,__u);
          if (bVar8) {
            pSVar6 = __u[1].
                     super__Tuple_impl<0UL,_std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Scope_*>
                     .super__Tuple_impl<1UL,_const_slang::ast::Scope_*>.
                     super__Head_base<1UL,_const_slang::ast::Scope_*,_false>._M_head_impl;
            if (local_98->kind != *(SyntaxKind *)&pSVar6->compilation) {
              SVar10 = parsing::Token::location(&local_58);
              this_00 = Scope::addDiag(local_e8,(DiagCode)0x2a000a,SVar10);
              Diagnostic::operator<<(this_00,local_d8);
              local_48._0_16_ =
                   getExternNameToken((SyntaxNode *)
                                      __u[1].
                                      super__Tuple_impl<0UL,_std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Scope_*>
                                      .super__Tuple_impl<1UL,_const_slang::ast::Scope_*>.
                                      super__Head_base<1UL,_const_slang::ast::Scope_*,_false>.
                                      _M_head_impl);
              SVar10 = parsing::Token::location((Token *)&local_48);
              Diagnostic::addNote(this_00,(DiagCode)0xa0001,SVar10);
              return;
            }
            if (local_98->kind == ExternModuleDecl) {
              checkExternModMatch(local_e8,(ModuleHeaderSyntax *)local_98[6].parent,
                                  *(ModuleHeaderSyntax **)&pSVar6[2].deferredMemberIndex,
                                  (DiagCode)0xc000d);
              return;
            }
            name._M_str = (char *)0xc000d;
            name._M_len = (size_t)local_d8._M_str;
            checkExternUdpMatch((ast *)local_e8,(Scope *)local_98[7].previewNode,
                                (UdpPortListSyntax *)pSVar6[3].nameMap,
                                (UdpPortListSyntax *)local_d8._M_len,name,
                                SUB84(in_stack_ffffffffffffff08,0));
            return;
          }
          uVar9 = uVar9 - 1 & uVar9;
        } while (uVar9 != 0);
        bVar11 = pgVar3[uVar14].m[0xf].n;
        hash = local_a0;
        pos0 = local_c0;
        scope = local_e8;
        uVar12 = local_a8;
        uVar14 = local_b0;
        uVar15 = local_b8;
        uVar17 = local_78;
        uVar18 = uStack_77;
        uVar19 = uStack_76;
        bVar20 = bStack_75;
        uVar21 = uStack_74;
        uVar22 = uStack_73;
        uVar23 = uStack_72;
        bVar24 = bStack_71;
        uVar25 = uStack_70;
        uVar26 = uStack_6f;
        uVar27 = uStack_6e;
        bVar28 = bStack_6d;
        uVar29 = uStack_6c;
        uVar30 = uStack_6b;
        uVar31 = uStack_6a;
        bVar32 = bStack_69;
      }
      if (((&boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>::
             is_not_overflowed(unsigned_long)::shift)[uVar15] & bVar11) == 0) break;
      uVar5 = (this->externDefMap).table_.
              super_table_core_impl<boost::unordered::detail::foa::flat_map_types<std::tuple<std::basic_string_view<char>,_const_slang::ast::Scope_*>,_const_slang::syntax::SyntaxNode_*>,_slang::hash<std::tuple<std::basic_string_view<char>,_const_slang::ast::Scope_*>_>,_std::equal_to<std::tuple<std::basic_string_view<char>,_const_slang::ast::Scope_*>_>,_std::allocator<std::pair<const_std::tuple<std::basic_string_view<char>,_const_slang::ast::Scope_*>,_const_slang::syntax::SyntaxNode_*>_>_>
              .arrays.groups_size_mask;
      lVar13 = uVar14 + uVar12;
      uVar12 = uVar12 + 1;
      uVar14 = lVar13 + 1U & uVar5;
    } while (uVar12 <= uVar5);
    if ((this->externDefMap).table_.
        super_table_core_impl<boost::unordered::detail::foa::flat_map_types<std::tuple<std::basic_string_view<char>,_const_slang::ast::Scope_*>,_const_slang::syntax::SyntaxNode_*>,_slang::hash<std::tuple<std::basic_string_view<char>,_const_slang::ast::Scope_*>_>,_std::equal_to<std::tuple<std::basic_string_view<char>,_const_slang::ast::Scope_*>_>,_std::allocator<std::pair<const_std::tuple<std::basic_string_view<char>,_const_slang::ast::Scope_*>,_const_slang::syntax::SyntaxNode_*>_>_>
        .size_ctrl.size <
        (this->externDefMap).table_.
        super_table_core_impl<boost::unordered::detail::foa::flat_map_types<std::tuple<std::basic_string_view<char>,_const_slang::ast::Scope_*>,_const_slang::syntax::SyntaxNode_*>,_slang::hash<std::tuple<std::basic_string_view<char>,_const_slang::ast::Scope_*>_>,_std::equal_to<std::tuple<std::basic_string_view<char>,_const_slang::ast::Scope_*>_>,_std::allocator<std::pair<const_std::tuple<std::basic_string_view<char>,_const_slang::ast::Scope_*>,_const_slang::syntax::SyntaxNode_*>_>_>
        .size_ctrl.ml) {
      boost::unordered::detail::foa::
      table_core<boost::unordered::detail::foa::flat_map_types<std::tuple<std::basic_string_view<char,std::char_traits<char>>,slang::ast::Scope_const*>,slang::syntax::SyntaxNode_const*>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<std::tuple<std::basic_string_view<char,std::char_traits<char>>,slang::ast::Scope_const*>,void>,std::equal_to<std::tuple<std::basic_string_view<char,std::char_traits<char>>,slang::ast::Scope_const*>>,std::allocator<std::pair<std::tuple<std::basic_string_view<char,std::char_traits<char>>,slang::ast::Scope_const*>const,slang::syntax::SyntaxNode_const*>>>
      ::
      unchecked_emplace_at<boost::unordered::detail::foa::try_emplace_args_t,std::tuple<std::basic_string_view<char,std::char_traits<char>>,slang::ast::Scope_const*>,slang::syntax::SyntaxNode_const*>
                (&local_48,local_e0,pos0,hash,&local_e9,&local_90,&local_c8);
    }
    else {
      boost::unordered::detail::foa::
      table_core<boost::unordered::detail::foa::flat_map_types<std::tuple<std::basic_string_view<char,std::char_traits<char>>,slang::ast::Scope_const*>,slang::syntax::SyntaxNode_const*>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<std::tuple<std::basic_string_view<char,std::char_traits<char>>,slang::ast::Scope_const*>,void>,std::equal_to<std::tuple<std::basic_string_view<char,std::char_traits<char>>,slang::ast::Scope_const*>>,std::allocator<std::pair<std::tuple<std::basic_string_view<char,std::char_traits<char>>,slang::ast::Scope_const*>const,slang::syntax::SyntaxNode_const*>>>
      ::
      unchecked_emplace_with_rehash<boost::unordered::detail::foa::try_emplace_args_t,std::tuple<std::basic_string_view<char,std::char_traits<char>>,slang::ast::Scope_const*>,slang::syntax::SyntaxNode_const*>
                (&local_48,local_e0,hash,&local_e9,&local_90,&local_c8);
    }
  }
  return;
}

Assistant:

void Compilation::noteExternDefinition(const Scope& scope, const SyntaxNode& syntax) {
    SLANG_ASSERT(!isFrozen());

    auto nameToken = getExternNameToken(syntax);
    auto name = nameToken.valueText();
    if (name.empty())
        return;

    auto targetScope = scope.asSymbol().kind == SymbolKind::CompilationUnit ? root.get() : &scope;
    auto [it, inserted] = externDefMap.emplace(std::tuple(name, targetScope), &syntax);
    if (!inserted) {
        if (syntax.kind != it->second->kind) {
            auto& diag = scope.addDiag(diag::Redefinition, nameToken.location());
            diag << name;
            diag.addNote(diag::NotePreviousDefinition, getExternNameToken(*it->second).location());
        }
        else if (syntax.kind == SyntaxKind::ExternModuleDecl) {
            checkExternModMatch(scope, *syntax.as<ExternModuleDeclSyntax>().header,
                                *it->second->as<ExternModuleDeclSyntax>().header,
                                diag::ExternDeclMismatchPrev);
        }
        else {
            checkExternUdpMatch(scope, *syntax.as<ExternUdpDeclSyntax>().portList,
                                *it->second->as<ExternUdpDeclSyntax>().portList, name,
                                diag::ExternDeclMismatchPrev);
        }
    }
}